

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O0

void __thiscall dns::Exception::~Exception(Exception *this)

{
  Exception *in_RDI;
  
  ~Exception(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual ~Exception() throw() { }